

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O0

mraa_result_t mraa_gpio_mode(mraa_gpio_context dev,mraa_gpio_mode_t mode)

{
  uint uVar1;
  int iVar2;
  mraa_gpiod_line_info *__ptr;
  int *piVar3;
  char *pcVar4;
  ssize_t sVar5;
  bool bVar6;
  int local_dc;
  char local_d8 [4];
  int length;
  char bu [64];
  char local_88 [4];
  int drive;
  char filepath [64];
  int k_1;
  mraa_gpiod_line_info *linfo;
  _gpio_group *p_Stack_30;
  int k;
  mraa_gpiod_group_t gpio_iter;
  int line_handle;
  uint flags;
  mraa_result_t pre_ret;
  mraa_gpio_mode_t mode_local;
  mraa_gpio_context dev_local;
  
  if (dev == (mraa_gpio_context)0x0) {
    syslog(3,"gpio: mode: context is invalid");
    dev_local._4_4_ = MRAA_ERROR_INVALID_HANDLE;
  }
  else if (((dev == (mraa_gpio_context)0x0) || (dev->advance_func == (mraa_adv_func_t *)0x0)) ||
          (dev->advance_func->gpio_mode_replace ==
           (_func_mraa_result_t_mraa_gpio_context_mraa_gpio_mode_t *)0x0)) {
    if (((dev == (mraa_gpio_context)0x0) || (dev->advance_func == (mraa_adv_func_t *)0x0)) ||
       ((dev->advance_func->gpio_mode_pre ==
         (_func_mraa_result_t_mraa_gpio_context_mraa_gpio_mode_t *)0x0 ||
        (dev_local._4_4_ = (*dev->advance_func->gpio_mode_pre)(dev,mode),
        dev_local._4_4_ == MRAA_SUCCESS)))) {
      if (plat->chardev_capable == 0) {
        if (dev->value_fp != -1) {
          close(dev->value_fp);
          dev->value_fp = -1;
        }
        snprintf(local_88,0x40,"/sys/class/gpio/gpio%d/drive",(ulong)(uint)dev->pin);
        iVar2 = open(local_88,1);
        if (iVar2 == -1) {
          uVar1 = dev->pin;
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          syslog(3,"gpio%i: mode: Failed to open \'drive\' for writing: %s",(ulong)uVar1,pcVar4);
          return MRAA_ERROR_INVALID_RESOURCE;
        }
        switch(mode) {
        case MRAA_GPIO_STRONG:
          local_dc = snprintf(local_d8,0x40,"strong");
          break;
        case MRAA_GPIO_PULLUP:
          local_dc = snprintf(local_d8,0x40,"pullup");
          break;
        case MRAA_GPIO_PULLDOWN:
          local_dc = snprintf(local_d8,0x40,"pulldown");
          break;
        case MRAA_GPIO_HIZ:
          local_dc = snprintf(local_d8,0x40,"hiz");
          break;
        default:
          close(iVar2);
          return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
        }
        sVar5 = write(iVar2,local_d8,(long)local_dc);
        if (sVar5 == -1) {
          uVar1 = dev->pin;
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          syslog(3,"gpio%i: mode: Failed to write to \'drive\': %s",(ulong)uVar1,pcVar4);
          close(iVar2);
          return MRAA_ERROR_INVALID_RESOURCE;
        }
        close(iVar2);
      }
      else {
        gpio_iter._4_4_ = 0;
        _mraa_close_gpio_desc(dev);
        linfo._4_4_ = 0;
        while( true ) {
          bVar6 = false;
          if (linfo._4_4_ < dev->num_chips) {
            p_Stack_30 = dev->gpio_group + (int)linfo._4_4_;
            bVar6 = p_Stack_30 != (_gpio_group *)0x0;
          }
          if (!bVar6) goto LAB_0010dae1;
          if (dev->gpio_group[(int)linfo._4_4_].is_required != 0) break;
          linfo._4_4_ = linfo._4_4_ + 1;
        }
        __ptr = mraa_get_line_info_by_chip_number(p_Stack_30->gpio_chip,*p_Stack_30->gpio_lines);
        if (__ptr == (mraa_gpiod_line_info *)0x0) {
          syslog(3,"[GPIOD_INTERFACE]: error getting line info");
          return MRAA_ERROR_UNSPECIFIED;
        }
        gpio_iter._4_4_ = __ptr->flags;
        free(__ptr);
LAB_0010dae1:
        if (mode == MRAA_GPIOD_ACTIVE_LOW) {
          gpio_iter._4_4_ = gpio_iter._4_4_ | 4;
        }
        else if (mode == MRAA_GPIOD_OPEN_DRAIN) {
          gpio_iter._4_4_ = gpio_iter._4_4_ | 8;
        }
        else {
          if (mode != MRAA_GPIOD_OPEN_SOURCE) {
            return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
          }
          gpio_iter._4_4_ = gpio_iter._4_4_ | 0x10;
        }
        filepath[0x3c] = '\0';
        filepath[0x3d] = '\0';
        filepath[0x3e] = '\0';
        filepath[0x3f] = '\0';
        while( true ) {
          bVar6 = false;
          if ((uint)filepath._60_4_ < dev->num_chips) {
            p_Stack_30 = dev->gpio_group + (int)filepath._60_4_;
            bVar6 = p_Stack_30 != (_gpio_group *)0x0;
          }
          if (!bVar6) break;
          if (dev->gpio_group[(int)filepath._60_4_].is_required != 0) {
            iVar2 = mraa_get_lines_handle
                              (p_Stack_30->dev_fd,p_Stack_30->gpio_lines,p_Stack_30->num_gpio_lines,
                               gpio_iter._4_4_,0);
            if (iVar2 < 1) {
              syslog(3,"[GPIOD_INTERFACE]: error getting line handle");
              return MRAA_ERROR_INVALID_RESOURCE;
            }
            p_Stack_30->gpiod_handle = iVar2;
          }
          filepath._60_4_ = filepath._60_4_ + 1;
        }
      }
      if (((dev == (mraa_gpio_context)0x0) || (dev->advance_func == (mraa_adv_func_t *)0x0)) ||
         (dev->advance_func->gpio_mode_post ==
          (_func_mraa_result_t_mraa_gpio_context_mraa_gpio_mode_t *)0x0)) {
        dev_local._4_4_ = MRAA_SUCCESS;
      }
      else {
        dev_local._4_4_ = (*dev->advance_func->gpio_mode_post)(dev,mode);
      }
    }
  }
  else {
    dev_local._4_4_ = (*dev->advance_func->gpio_mode_replace)(dev,mode);
  }
  return dev_local._4_4_;
}

Assistant:

mraa_result_t
mraa_gpio_mode(mraa_gpio_context dev, mraa_gpio_mode_t mode)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "gpio: mode: context is invalid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, gpio_mode_replace))
        return dev->advance_func->gpio_mode_replace(dev, mode);

    if (IS_FUNC_DEFINED(dev, gpio_mode_pre)) {
        mraa_result_t pre_ret = (dev->advance_func->gpio_mode_pre(dev, mode));
        if (pre_ret != MRAA_SUCCESS)
            return pre_ret;
    }

    if (plat->chardev_capable) {
        unsigned flags = 0;
        int line_handle;
        mraa_gpiod_group_t gpio_iter;

        _mraa_close_gpio_desc(dev);

        /* We save flag values from the first valid line. */
        for_each_gpio_group(gpio_iter, dev)
        {
            mraa_gpiod_line_info* linfo =
            mraa_get_line_info_by_chip_number(gpio_iter->gpio_chip, gpio_iter->gpio_lines[0]);
            if (!linfo) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: error getting line info");
                return MRAA_ERROR_UNSPECIFIED;
            }
            flags = linfo->flags;
            free(linfo);

            /* We don't need to iterate any further. */
            break;
        }

        /* Without changing the API, for now, we can request only one mode per call. */
        switch (mode) {
            case MRAA_GPIOD_ACTIVE_LOW:
                flags |= GPIOHANDLE_REQUEST_ACTIVE_LOW;
                break;
            case MRAA_GPIOD_OPEN_DRAIN:
                flags |= GPIOHANDLE_REQUEST_OPEN_DRAIN;
                break;
            case MRAA_GPIOD_OPEN_SOURCE:
                flags |= GPIOHANDLE_REQUEST_OPEN_SOURCE;
                break;
            default:
                return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
        }

        for_each_gpio_group(gpio_iter, dev)
        {
            line_handle = mraa_get_lines_handle(gpio_iter->dev_fd, gpio_iter->gpio_lines,
                                                gpio_iter->num_gpio_lines, flags, 0);
            if (line_handle <= 0) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: error getting line handle");
                return MRAA_ERROR_INVALID_RESOURCE;
            }

            gpio_iter->gpiod_handle = line_handle;
        }
    } else {

        if (dev->value_fp != -1) {
            close(dev->value_fp);
            dev->value_fp = -1;
        }

        char filepath[MAX_SIZE];
        snprintf(filepath, MAX_SIZE, SYSFS_CLASS_GPIO "/gpio%d/drive", dev->pin);

        int drive = open(filepath, O_WRONLY);
        if (drive == -1) {
            syslog(LOG_ERR, "gpio%i: mode: Failed to open 'drive' for writing: %s", dev->pin, strerror(errno));
            return MRAA_ERROR_INVALID_RESOURCE;
        }

        char bu[MAX_SIZE];
        int length;
        switch (mode) {
            case MRAA_GPIO_STRONG:
                length = snprintf(bu, sizeof(bu), "strong");
                break;
            case MRAA_GPIO_PULLUP:
                length = snprintf(bu, sizeof(bu), "pullup");
                break;
            case MRAA_GPIO_PULLDOWN:
                length = snprintf(bu, sizeof(bu), "pulldown");
                break;
            case MRAA_GPIO_HIZ:
                length = snprintf(bu, sizeof(bu), "hiz");
                break;
            default:
                close(drive);
                return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
        }
        if (write(drive, bu, length * sizeof(char)) == -1) {
            syslog(LOG_ERR, "gpio%i: mode: Failed to write to 'drive': %s", dev->pin, strerror(errno));
            close(drive);
            return MRAA_ERROR_INVALID_RESOURCE;
        }

        close(drive);
    }

    if (IS_FUNC_DEFINED(dev, gpio_mode_post))
        return dev->advance_func->gpio_mode_post(dev, mode);

    return MRAA_SUCCESS;
}